

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execLea<(moira::Instr)67,(moira::Mode)6,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  ushort in_SI;
  Moira *in_RDI;
  Moira *unaff_retaddr;
  int dst;
  int src;
  
  uVar2 = computeEA<(moira::Mode)6,(moira::Size)4,0ul>(unaff_retaddr,(u32)((ulong)in_RDI >> 0x20));
  *(u32 *)((long)in_RDI->exec + (long)(int)((int)(uint)in_SI >> 9 & 7) * 4 + -0x38) = uVar2;
  bVar1 = isIdxMode(MODE_IX);
  if (bVar1) {
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  }
  prefetch<4ul>(in_RDI);
  return;
}

Assistant:

void
Moira::execLea(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    reg.a[dst] = computeEA<M,S>(src);
    if (isIdxMode(M)) sync(2);

    prefetch<POLLIPL>();
}